

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O2

void __thiscall
Js::InterpreterStackFrame::
DoInitConstFld<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout,Var instance,
          PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  PropertyId pid;
  undefined4 *puVar3;
  RecyclableObject *instance_00;
  Var newValue;
  InlineCache *local_38;
  InlineCache *inlineCache;
  
  local_38 = GetInlineCache(this,playout->inlineCacheIndex);
  bVar2 = TaggedNumber::Is(instance);
  if (bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x1386,"(!TaggedNumber::Is(instance))",
                                "!TaggedNumber::Is(instance)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pid = GetPropertyIdFromCacheId(this,playout->inlineCacheIndex);
  instance_00 = UnsafeVarTo<Js::RecyclableObject>(instance);
  bVar2 = TrySetPropertyLocalFastPath<Js::OpLayoutT_ElementRootCP<Js::LayoutSizePolicy<(Js::LayoutSize)0>>const__unaligned>
                    (this,playout,pid,instance_00,&local_38,flags);
  if (!bVar2) {
    newValue = GetReg<unsigned_char>(this,playout->Value);
    JavascriptOperators::OP_InitConstProperty(instance,pid,newValue);
  }
  return;
}

Assistant:

void InterpreterStackFrame::DoInitConstFld(const unaligned T * playout, Var instance, PropertyOperationFlags flags)
    {
        uint inlineCacheIndex = playout->inlineCacheIndex;
        InlineCache * inlineCache = this->GetInlineCache(inlineCacheIndex);

        Assert(!TaggedNumber::Is(instance));
        PropertyId propertyId = GetPropertyIdFromCacheId(playout->inlineCacheIndex);
        if (!TrySetPropertyLocalFastPath(playout, propertyId, UnsafeVarTo<RecyclableObject>(instance), inlineCache, flags))
        {
            JavascriptOperators::OP_InitConstProperty(instance, propertyId, GetReg(playout->Value));
        }
    }